

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

int __thiscall QDir::rmdir(QDir *this,char *__path)

{
  bool bVar1;
  int iVar2;
  pointer pQVar3;
  long in_FS_OFFSET;
  QDirPrivate *d;
  QString fn;
  QString *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined5 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  byte local_79;
  undefined1 *local_78;
  undefined1 *local_70;
  QDir *in_stack_ffffffffffffffa0;
  char local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDir *)0x2802a5);
  bVar1 = QString::isEmpty((QString *)0x2802b4);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this,
               (char *)CONCAT17(in_stack_ffffffffffffff4f,
                                CONCAT16(in_stack_ffffffffffffff4e,
                                         CONCAT15(in_stack_ffffffffffffff4d,
                                                  in_stack_ffffffffffffff48))),
               in_stack_ffffffffffffff44,(char *)in_stack_ffffffffffffff38);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffa0,"QDir::rmdir: Empty or null file name");
    local_79 = 0;
  }
  else {
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    filePath(in_stack_ffffffffffffffa0,(QString *)&DAT_aaaaaaaaaaaaaaaa);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *
                       )0x280330);
    if (bVar1) {
      pQVar3 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x2803bf);
      iVar2 = (*pQVar3->_vptr_QAbstractFileEngine[0x10])(pQVar3,&local_78,0);
      local_79 = (byte)iVar2;
    }
    else {
      QFileSystemEntry::QFileSystemEntry
                ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      iVar2 = QFileSystemEngine::rmdir(local_40);
      local_79 = (byte)iVar2;
      QFileSystemEntry::~QFileSystemEntry
                ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
    local_79 = local_79 & 1;
    QString::~QString((QString *)0x2803f7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_79);
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::rmdir(const QString &dirName) const
{
    Q_D(const QDir);

    if (dirName.isEmpty()) {
        qWarning("QDir::rmdir: Empty or null file name");
        return false;
    }

    QString fn = filePath(dirName);
    if (!d->fileEngine)
        return QFileSystemEngine::rmdir(QFileSystemEntry(fn));

    return d->fileEngine->rmdir(fn, false);
}